

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option_button.cpp
# Opt level: O2

Am_Value option_button_value_proc(Am_Object *self)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value aVar4;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_01;
  Am_Object *in_RSI;
  Am_Value AVar5;
  Am_Value v;
  Am_Object sub_menu;
  Am_Value firstv;
  Am_Value_List items;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object((Am_Object *)&v,(Am_Slot_Key)in_RSI,0x1d2);
  Am_Object::Get_Object(&sub_menu,(Am_Slot_Key)&v,0x1d2);
  Am_Object::~Am_Object((Am_Object *)&v);
  pAVar3 = Am_Object::Get(&sub_menu,0x169,1);
  Am_Value::operator=((Am_Value *)self,pAVar3);
  bVar1 = Am_Value::Valid((Am_Value *)self);
  if (!bVar1) {
    v.type = 0;
    v.value.wrapper_value = (Am_Wrapper *)0x0;
    pAVar3 = Am_Object::Get(in_RSI,0xa2,1);
    Am_Value::operator=(&v,pAVar3);
    Am_Value::operator=((Am_Value *)self,&Am_No_Value);
    bVar1 = Am_Value::Valid(&v);
    bVar2 = true;
    if (bVar1) {
      bVar1 = Am_Value_List::Test(&v);
      if (!bVar1) goto LAB_0026e184;
      Am_Value_List::Am_Value_List(&items,&v);
      firstv.type = 0;
      firstv.value.wrapper_value = (Am_Wrapper *)0x0;
      Am_Value_List::Start(&items);
      pAVar3 = Am_Value_List::Get(&items);
      Am_Value::operator=(&firstv,pAVar3);
      while( true ) {
        bVar2 = Am_Value_List::Last(&items);
        if (bVar2) break;
        pAVar3 = Am_Value_List::Get(&items);
        Am_Value::operator=((Am_Value *)self,pAVar3);
        bVar1 = Am_Value::Valid((Am_Value *)self);
        if (bVar1) {
          bVar1 = get_value_to_use_for_value_from((Am_Value *)self);
          if (bVar1) goto LAB_0026e19e;
        }
        Am_Value_List::Next(&items);
      }
      Am_Value::operator=((Am_Value *)self,&firstv);
      get_value_to_use_for_value_from((Am_Value *)self);
LAB_0026e19e:
      bVar1 = !bVar2;
      Am_Value::~Am_Value(&firstv);
      Am_Value_List::~Am_Value_List(&items);
    }
    else {
LAB_0026e184:
      bVar1 = false;
    }
    Am_Value::~Am_Value(&v);
    if (bVar2 == false) {
      Am_Object::~Am_Object(&sub_menu);
      aVar4 = extraout_RDX_00;
      if (!bVar1) {
        Am_Value::~Am_Value((Am_Value *)self);
        aVar4 = extraout_RDX_01;
      }
      goto LAB_0026e1d2;
    }
  }
  Am_Object::~Am_Object(&sub_menu);
  aVar4 = extraout_RDX;
LAB_0026e1d2:
  AVar5.value.wrapper_value = aVar4.wrapper_value;
  AVar5._0_8_ = self;
  return AVar5;
}

Assistant:

Am_Define_Formula(Am_Value, option_button_value)
{
  Am_Value value;
  Am_Object sub_menu = self.Get_Object(Am_SUB_MENU).Get_Object(Am_SUB_MENU);
  value = sub_menu.Peek(Am_VALUE);
  if (!value.Valid()) {
    Am_Value v;
    v = self.Peek(Am_ITEMS);
    value = Am_No_Value;
    if (v.Valid() && Am_Value_List::Test(v)) {
      Am_Value_List items = v;
      Am_Value firstv;
      //search for a valid item
      items.Start();
      firstv = items.Get(); //save first item
      for (; !items.Last(); items.Next()) {
        value = items.Get();
        if (value.Valid()) {
          if (get_value_to_use_for_value_from(value))
            return value;
        }
      }
      //if get here, then all items are inactive, just use first one
      value = firstv;
      get_value_to_use_for_value_from(value);
    }
  }
  return value;
}